

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O0

int gost_ec_verify(uchar *dgst,int dgst_len,ECDSA_SIG *sig,EC_KEY *ec)

{
  int iVar1;
  EC_GROUP *ctx_00;
  BIGNUM *r;
  BIGNUM *m;
  EC_POINT *q;
  EC_KEY *in_RCX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int ok;
  EC_POINT *pub_key;
  EC_POINT *C;
  BIGNUM *tmp;
  BIGNUM *X;
  BIGNUM *sig_r;
  BIGNUM *sig_s;
  BIGNUM *z2;
  BIGNUM *z1;
  BIGNUM *v;
  BIGNUM *R;
  BIGNUM *e;
  BIGNUM *md;
  BIGNUM *order;
  EC_GROUP *group;
  BN_CTX *ctx;
  char *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  int iVar2;
  EC_POINT *n;
  BIGNUM *local_80;
  BIGNUM *local_78;
  BIGNUM *local_70;
  BIGNUM *local_68;
  BIGNUM *local_60;
  BIGNUM *local_58;
  BIGNUM *local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  EC_GROUP *local_38;
  BN_CTX *local_30;
  EC_KEY *local_28;
  long local_20;
  int local_14;
  long local_10;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (in_RCX == (EC_KEY *)0x0) {
    ctx_00 = (EC_GROUP *)0x0;
  }
  else {
    ctx_00 = EC_KEY_get0_group(in_RCX);
  }
  local_48 = (BIGNUM *)0x0;
  local_50 = (BIGNUM *)0x0;
  local_58 = (BIGNUM *)0x0;
  local_60 = (BIGNUM *)0x0;
  local_68 = (BIGNUM *)0x0;
  local_70 = (BIGNUM *)0x0;
  local_78 = (BIGNUM *)0x0;
  local_80 = (BIGNUM *)0x0;
  n = (EC_POINT *)0x0;
  iVar2 = 0;
  local_38 = ctx_00;
  if (((local_10 == 0) || (local_20 == 0)) || (ctx_00 == (EC_GROUP *)0x0)) {
    OPENSSL_die("assertion failed: dgst != NULL && sig != NULL && group != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                ,0x152);
  }
  local_30 = BN_CTX_new();
  if (local_30 == (BN_CTX *)0x0) {
    ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffff48,0);
    local_4 = 0;
  }
  else {
    BN_CTX_start(local_30);
    local_40 = BN_CTX_get(local_30);
    local_50 = BN_CTX_get(local_30);
    local_68 = BN_CTX_get(local_30);
    local_70 = BN_CTX_get(local_30);
    r = BN_CTX_get(local_30);
    m = BN_CTX_get(local_30);
    local_58 = BN_CTX_get(local_30);
    local_60 = BN_CTX_get(local_30);
    if ((((local_40 == (BIGNUM *)0x0) || (local_50 == (BIGNUM *)0x0)) ||
        ((local_68 == (BIGNUM *)0x0 || ((local_70 == (BIGNUM *)0x0 || (r == (BIGNUM *)0x0)))))) ||
       ((m == (BIGNUM *)0x0 || ((local_58 == (BIGNUM *)0x0 || (local_60 == (BIGNUM *)0x0)))))) {
      ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffff48,0);
    }
    else {
      q = EC_KEY_get0_public_key(local_28);
      if ((q == (EC_POINT *)0x0) ||
         (iVar1 = EC_GROUP_get_order(local_38,local_40,local_30), iVar1 == 0)) {
        ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffff48,0);
      }
      else {
        ECDSA_SIG_get0(local_20,&local_80,&local_78);
        iVar1 = BN_is_zero(local_78);
        if (((iVar1 == 0) &&
            (((iVar1 = BN_is_zero(local_80), iVar1 == 0 &&
              (iVar1 = BN_is_negative(local_78), iVar1 == 0)) &&
             (iVar1 = BN_is_negative(local_80), iVar1 == 0)))) &&
           ((iVar1 = BN_ucmp(local_78,local_40), iVar1 < 0 &&
            (iVar1 = BN_ucmp(local_80,local_40), iVar1 < 0)))) {
          if ((local_14 != 0x20) && (local_14 != 0x40)) {
            OPENSSL_die("assertion failed: dgst_len == 32 || dgst_len == 64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_ec_sign.c"
                        ,0x176);
          }
          local_48 = (BIGNUM *)BN_lebin2bn(local_10,local_14,0);
          if ((local_48 == (BIGNUM *)0x0) ||
             (iVar1 = BN_div((BIGNUM *)0x0,local_50,local_48,local_40,local_30), iVar1 == 0)) {
            ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffff48,0);
          }
          else {
            iVar1 = BN_is_zero(local_50);
            if ((iVar1 == 0) || (iVar1 = BN_set_word(local_50,1), iVar1 != 0)) {
              local_60 = BN_mod_inverse(local_60,local_50,local_40,local_30);
              if ((((local_60 == (BIGNUM *)0x0) ||
                   (iVar1 = BN_mod_mul(local_68,local_78,local_60,local_40,local_30), iVar1 == 0))
                  || (iVar1 = BN_sub(r,local_40,local_80), iVar1 == 0)) ||
                 (iVar1 = BN_mod_mul(local_70,r,local_60,local_40,local_30), iVar1 == 0)) {
                ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffff48,0)
                ;
              }
              else {
                n = EC_POINT_new(local_38);
                if (n == (EC_POINT *)0x0) {
                  ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffff48,
                                 0);
                }
                else {
                  iVar1 = gost_ec_point_mul((EC_GROUP *)m,(EC_POINT *)r,(BIGNUM *)n,(EC_POINT *)q,
                                            (BIGNUM *)CONCAT44(iVar2,in_stack_ffffffffffffff58),
                                            (BN_CTX *)ctx_00);
                  if (iVar1 == 0) {
                    ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                                   in_stack_ffffffffffffff48,0);
                  }
                  else {
                    iVar1 = EC_POINT_get_affine_coordinates(local_38,n,m,0,local_30);
                    if (iVar1 == 0) {
                      ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                                     in_stack_ffffffffffffff48,0);
                    }
                    else {
                      iVar1 = BN_div((BIGNUM *)0x0,local_58,m,local_40,local_30);
                      if (iVar1 == 0) {
                        ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                                       in_stack_ffffffffffffff48,0);
                      }
                      else {
                        iVar1 = BN_cmp(local_58,local_80);
                        if (iVar1 == 0) {
                          iVar2 = 1;
                        }
                        else {
                          ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                                         in_stack_ffffffffffffff48,0);
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffff48,0);
            }
          }
        }
        else {
          ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,in_stack_ffffffffffffff48,0);
        }
      }
    }
    if (n != (EC_POINT *)0x0) {
      EC_POINT_free(n);
    }
    BN_CTX_end(local_30);
    BN_CTX_free(local_30);
    local_4 = iVar2;
    if (local_48 != (BIGNUM *)0x0) {
      BN_free(local_48);
      local_4 = iVar2;
    }
  }
  return local_4;
}

Assistant:

int gost_ec_verify(const unsigned char *dgst, int dgst_len,
                   ECDSA_SIG *sig, EC_KEY *ec)
{
    BN_CTX *ctx;
    const EC_GROUP *group = (ec) ? EC_KEY_get0_group(ec) : NULL;
    BIGNUM *order;
    BIGNUM *md = NULL, *e = NULL, *R = NULL, *v = NULL, *z1 = NULL, *z2 = NULL;
    const BIGNUM *sig_s = NULL, *sig_r = NULL;
    BIGNUM *X = NULL, *tmp = NULL;
    EC_POINT *C = NULL;
    const EC_POINT *pub_key = NULL;
    int ok = 0;

    OPENSSL_assert(dgst != NULL && sig != NULL && group != NULL);

    if (!(ctx = BN_CTX_new())) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    BN_CTX_start(ctx);
    order = BN_CTX_get(ctx);
    e = BN_CTX_get(ctx);
    z1 = BN_CTX_get(ctx);
    z2 = BN_CTX_get(ctx);
    tmp = BN_CTX_get(ctx);
    X = BN_CTX_get(ctx);
    R = BN_CTX_get(ctx);
    v = BN_CTX_get(ctx);
    if (!order || !e || !z1 || !z2 || !tmp || !X || !R || !v) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    pub_key = EC_KEY_get0_public_key(ec);
    if (!pub_key || !EC_GROUP_get_order(group, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_INTERNAL_ERROR);
        goto err;
    }

    ECDSA_SIG_get0(sig, &sig_r, &sig_s);

    if (BN_is_zero(sig_s) || BN_is_zero(sig_r) ||
        BN_is_negative(sig_s) || BN_is_negative(sig_r) ||
        BN_ucmp(sig_s, order) >= 0 || BN_ucmp(sig_r, order) >= 0) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, GOST_R_SIGNATURE_PARTS_GREATER_THAN_Q);
        goto err;
    }

    OPENSSL_assert(dgst_len == 32 || dgst_len == 64);
    md = BN_lebin2bn(dgst, dgst_len, NULL);
    if (!md || !BN_mod(e, md, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_INTERNAL_ERROR);
        goto err;
    }
#ifdef DEBUG_SIGN
    fprintf(stderr, "digest as bignum: ");
    BN_print_fp(stderr, md);
    fprintf(stderr, "\ndigest mod q: ");
    BN_print_fp(stderr, e);
#endif
    if (BN_is_zero(e) && !BN_one(e)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_INTERNAL_ERROR);
        goto err;
    }
    v = BN_mod_inverse(v, e, order, ctx);
    if (!v || !BN_mod_mul(z1, sig_s, v, order, ctx)
        || !BN_sub(tmp, order, sig_r)
        || !BN_mod_mul(z2, tmp, v, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_INTERNAL_ERROR);
        goto err;
    }
#ifdef DEBUG_SIGN
    fprintf(stderr, "\nInverted digest value: ");
    BN_print_fp(stderr, v);
    fprintf(stderr, "\nz1: ");
    BN_print_fp(stderr, z1);
    fprintf(stderr, "\nz2: ");
    BN_print_fp(stderr, z2);
#endif
    C = EC_POINT_new(group);
    if (!C) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    if (!gost_ec_point_mul(group, C, z1, pub_key, z2, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_EC_LIB);
        goto err;
    }
    if (!EC_POINT_get_affine_coordinates(group, C, X, NULL, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_EC_LIB);
        goto err;
    }
    if (!BN_mod(R, X, order, ctx)) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, ERR_R_INTERNAL_ERROR);
        goto err;
    }
#ifdef DEBUG_SIGN
    fprintf(stderr, "\nX=");
    BN_print_fp(stderr, X);
    fprintf(stderr, "\nX mod q=");
    BN_print_fp(stderr, R);
    fprintf(stderr, "\n");
#endif
    if (BN_cmp(R, sig_r) != 0) {
        GOSTerr(GOST_F_GOST_EC_VERIFY, GOST_R_SIGNATURE_MISMATCH);
    } else {
        ok = 1;
    }
 err:
    if (C)
        EC_POINT_free(C);
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    if (md)
        BN_free(md);
    return ok;
}